

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_> *this,
          ArrayBuilder<capnp::Orphan<capnp::compiler::Token>_> *other)

{
  Orphan<capnp::compiler::Token> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::compiler::Token>_> *pRVar2;
  Orphan<capnp::compiler::Token> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnp::compiler::Token> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (Orphan<capnp::compiler::Token> *)0x0;
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    this->endPtr = (Orphan<capnp::compiler::Token> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,
               (long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Token>_>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Orphan<capnp::compiler::Token> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  other->endPtr = (Orphan<capnp::compiler::Token> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }